

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O1

map * config_initialize_path(char *path)

{
  _Bool _Var1;
  __uid_t __uid;
  natwm_error nVar2;
  FILE *__stream;
  char *pcVar3;
  passwd *ppVar4;
  char *string;
  char *pcVar5;
  map *pmVar6;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 uVar7;
  char *local_28;
  size_t file_size;
  
  uVar7 = 0x1066d8;
  if (path == (char *)0x0) {
    local_28 = (char *)0x0;
    pcVar3 = getenv("XDG_CONFIG_HOME");
    if (pcVar3 == (char *)0x0) {
      pcVar3 = getenv("HOME");
      if (pcVar3 == (char *)0x0) {
        __uid = getuid();
        ppVar4 = getpwuid(__uid);
        if (ppVar4 == (passwd *)0x0) {
          local_28 = (char *)0x0;
          goto LAB_00106793;
        }
        pcVar3 = ppVar4->pw_dir;
      }
      local_28 = string_init(pcVar3);
      string_append(&local_28,"/.config/");
    }
    else {
      local_28 = string_init(pcVar3);
    }
LAB_00106793:
    if (local_28 == (char *)0x0) {
      __stream = (FILE *)0x0;
      internal_logger(natwm_logger,LEVEL_ERROR,"Failed to find HOME directory");
    }
    else {
      string_append(&local_28,"natwm/natwm.config");
      _Var1 = path_exists(local_28);
      if (_Var1) {
        __stream = fopen(local_28,"r");
        if (__stream != (FILE *)0x0) {
          free(local_28);
          goto LAB_00106842;
        }
        pcVar3 = "Failed to open %s";
      }
      else {
        pcVar3 = "Failed to find configuration file at %s";
      }
      internal_logger(natwm_logger,LEVEL_ERROR,pcVar3,local_28);
      free(local_28);
      __stream = (FILE *)0x0;
    }
  }
  else {
    __stream = fopen(path,"r");
    if (__stream == (FILE *)0x0) {
      __stream = (FILE *)0x0;
      internal_logger(natwm_logger,LEVEL_ERROR,"Failed to find configuration file at %s",path,in_R8,
                      in_R9,uVar7);
    }
  }
LAB_00106842:
  if (__stream == (FILE *)0x0) {
    return (map *)0x0;
  }
  local_28 = (char *)0x0;
  nVar2 = get_file_size((FILE *)__stream,(size_t *)&local_28);
  pcVar3 = local_28;
  if ((nVar2 == NO_ERROR) &&
     (string = (char *)malloc((size_t)(local_28 + 1)), string != (char *)0x0)) {
    pcVar5 = (char *)fread(string,1,(size_t)pcVar3,__stream);
    if (pcVar5 == pcVar3) {
      string[(long)pcVar3] = '\0';
      pmVar6 = config_read_string(string,(size_t)local_28);
      free(string);
      if (pmVar6 != (map *)0x0) goto LAB_001068bf;
    }
    else {
      free(string);
    }
  }
  pmVar6 = (map *)0x0;
LAB_001068bf:
  fclose(__stream);
  return pmVar6;
}

Assistant:

struct map *config_initialize_path(const char *path)
{
        FILE *file = open_config_file(path);

        if (file == NULL) {
                return NULL;
        }

        size_t file_size = 0;

        if (get_file_size(file, &file_size) != NO_ERROR) {
                goto close_file_and_error;
        }

        char *file_buffer = NULL;

        if (read_file_into_buffer(file, &file_buffer, file_size) != 0) {
                goto close_file_and_error;
        }

        struct map *config = config_read_string(file_buffer, file_size);

        if (config == NULL) {
                free(file_buffer);

                goto close_file_and_error;
        }

        free(file_buffer);
        fclose(file);

        return config;

close_file_and_error:
        fclose(file);

        return NULL;
}